

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.c
# Opt level: O2

void av1_convolve_2d_sr_avx2
               (uint8_t *src,int32_t src_stride,uint8_t *dst,int32_t dst_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int32_t subpel_x_qn,int32_t subpel_y_qn,ConvolveParams *conv_params)

{
  __m256i *palVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  int16_t *piVar5;
  __m256i alVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  __m256i alVar15;
  __m256i alVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  long lVar31;
  __m256i alVar32;
  __m256i alVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  undefined1 (*pauVar37) [32];
  long lVar38;
  byte bVar39;
  byte bVar40;
  long lVar41;
  long lVar42;
  undefined1 (*pauVar43) [16];
  uint8_t *puVar44;
  long lVar45;
  long lVar46;
  __m256i *extraout_RDX;
  __m256i *filt;
  undefined1 (*pauVar47) [16];
  long lVar48;
  ulong uVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  uint uVar53;
  uint uVar54;
  int iVar55;
  long lVar56;
  undefined8 *puVar57;
  uint uVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  undefined1 (*pauVar62) [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  __m256i alVar66;
  __m256i alVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  short sVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  __m256i alVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  __m256i s [12];
  __m256i coeffs_h [6];
  __m256i coeffs_v [6];
  int16_t im_block [1120];
  undefined4 in_stack_ffffffffffff6dc0;
  undefined4 in_stack_ffffffffffff6dc4;
  undefined1 in_stack_ffffffffffff6dc8 [12];
  undefined1 local_9120 [32];
  undefined1 local_9060 [32];
  undefined4 uStack_8f78;
  undefined4 uStack_8f74;
  undefined4 uStack_8f70;
  undefined4 uStack_8f6c;
  undefined4 uStack_8f68;
  undefined4 uStack_8f64;
  __m256i local_8f60;
  __m256i local_8f40;
  __m256i local_8f20;
  __m256i local_8f00;
  __m256i local_8ee0;
  __m256i local_8ec0;
  __m256i local_8ea0;
  __m256i local_8e80;
  __m256i local_8e60;
  __m256i local_8e40;
  __m256i local_8e20;
  __m256i local_8e00;
  __m256i local_8de0;
  undefined1 local_8dc0 [32];
  undefined1 local_8da0 [32];
  undefined8 local_8d80;
  undefined8 uStack_8d78;
  undefined8 uStack_8d70;
  undefined8 uStack_8d68;
  undefined8 local_8d60;
  undefined8 uStack_8d58;
  undefined8 uStack_8d50;
  undefined8 uStack_8d48;
  undefined8 local_8d40;
  undefined8 uStack_8d38;
  undefined8 uStack_8d30;
  undefined8 uStack_8d28;
  longlong local_8d20;
  longlong lStack_8d18;
  longlong lStack_8d10;
  longlong lStack_8d08;
  undefined8 local_8d00;
  undefined8 uStack_8cf8;
  undefined8 uStack_8cf0;
  undefined8 uStack_8ce8;
  undefined8 local_8ce0;
  undefined8 uStack_8cd8;
  undefined8 uStack_8cd0;
  undefined8 uStack_8cc8;
  undefined8 local_8cc0;
  undefined8 uStack_8cb8;
  undefined8 uStack_8cb0;
  undefined8 uStack_8ca8;
  undefined8 local_8ca0;
  undefined8 uStack_8c98;
  undefined8 uStack_8c90;
  undefined8 uStack_8c88;
  undefined8 local_8c80;
  undefined8 uStack_8c78;
  undefined8 uStack_8c70;
  undefined8 uStack_8c68;
  undefined1 local_8c60 [16];
  undefined1 auStack_8c50 [16];
  undefined1 local_8c40 [16];
  undefined1 auStack_8c30 [16];
  undefined1 local_8c20 [16];
  undefined1 auStack_8c10 [16];
  undefined1 local_8c00 [16];
  undefined1 auStack_8bf0 [16];
  undefined1 local_8be0 [16];
  undefined1 auStack_8bd0 [16];
  undefined1 local_8bc0 [16];
  undefined1 auStack_8bb0 [35712];
  undefined1 auVar86 [64];
  undefined1 auVar89 [64];
  
  uVar34 = get_filter_tap(filter_params_x,subpel_x_qn);
  uVar35 = get_filter_tap(filter_params_y,subpel_y_qn);
  if (uVar35 == 0xc || uVar34 == 0xc) {
    uVar4 = filter_params_x->taps;
    lVar45 = (long)src_stride;
    lVar41 = (long)h;
    lVar42 = (long)dst_stride;
    lVar56 = (long)w;
    if (uVar4 < 9) {
      iVar52 = conv_params->round_0;
      bVar40 = 0x16 - (char)iVar52;
      uVar58 = iVar52 - 1;
      uVar54 = 0xe - (iVar52 + conv_params->round_1);
      bVar39 = (byte)conv_params->round_1;
      iVar59 = ((1 << (bVar39 & 0x1f)) >> 1) + (1 << (bVar40 & 0x1f));
      sVar75 = (short)((uint)(1 << ((byte)uVar58 & 0x1f)) >> 1) + 0x2000;
      uVar34 = conv_params->round_1;
      iVar52 = 1 << (bVar40 - bVar39 & 0x1f);
      iVar52 = ((1 << ((byte)uVar54 & 0x1f)) >> 1) - ((iVar52 >> 1) + iVar52);
      prepare_coeffs_lowbd(filter_params_x,subpel_x_qn,&local_8de0);
      prepare_coeffs(filter_params_y,subpel_y_qn,(__m256i *)&local_8d20);
      uVar35 = get_filter_tap(filter_params_x,subpel_x_qn);
      uVar53 = get_filter_tap(filter_params_y,subpel_y_qn);
      if (uVar35 == 6) {
        auVar68._16_16_ =
             *(undefined1 (*) [16])
              (filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)uVar4);
        auVar68._0_16_ =
             *(undefined1 (*) [16])
              (filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)uVar4);
        auVar68 = vpsraw_avx2(auVar68,1);
        local_8de0 = (__m256i)vpshufb_avx2(auVar68,_DAT_004c33e0);
        local_8dc0 = vpshufb_avx2(auVar68,_DAT_004c3400);
        local_8da0 = vpshufb_avx2(auVar68,_DAT_004c3420);
      }
      else {
        prepare_coeffs_lowbd(filter_params_x,subpel_x_qn,&local_8de0);
      }
      if (uVar53 == 6) {
        piVar5 = filter_params_y->filter_ptr;
        uVar49 = (ulong)((uint)filter_params_y->taps * (subpel_y_qn & 0xfU));
        local_9120._4_4_ = *(undefined4 *)(piVar5 + uVar49 + 1);
        local_9120._0_4_ = local_9120._4_4_;
        local_9120._8_4_ = local_9120._4_4_;
        local_9120._12_4_ = local_9120._4_4_;
        local_9120._16_4_ = local_9120._4_4_;
        local_9120._20_4_ = local_9120._4_4_;
        local_9120._24_4_ = local_9120._4_4_;
        local_9120._28_4_ = local_9120._4_4_;
        uVar2 = *(undefined4 *)(piVar5 + uVar49 + 3);
        auVar87._4_4_ = uVar2;
        auVar87._0_4_ = uVar2;
        auVar87._8_4_ = uVar2;
        auVar87._12_4_ = uVar2;
        auVar87._16_4_ = uVar2;
        auVar87._20_4_ = uVar2;
        auVar87._24_4_ = uVar2;
        auVar87._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(piVar5 + uVar49 + 5);
        auVar90._4_4_ = uVar2;
        auVar90._0_4_ = uVar2;
        auVar90._8_4_ = uVar2;
        auVar90._12_4_ = uVar2;
        auVar90._16_4_ = uVar2;
        auVar90._20_4_ = uVar2;
        auVar90._24_4_ = uVar2;
        auVar90._28_4_ = uVar2;
      }
      else {
        prepare_coeffs(filter_params_y,subpel_y_qn,(__m256i *)&local_8d20);
        local_9120._8_8_ = lStack_8d18;
        local_9120._0_8_ = local_8d20;
        local_9120._16_8_ = lStack_8d10;
        local_9120._24_8_ = lStack_8d08;
        auVar87._8_8_ = uStack_8cf8;
        auVar87._0_8_ = local_8d00;
        auVar87._16_8_ = uStack_8cf0;
        auVar87._24_8_ = uStack_8ce8;
        auVar90._8_8_ = uStack_8cd8;
        auVar90._0_8_ = local_8ce0;
        auVar90._16_8_ = uStack_8cd0;
        auVar90._24_8_ = uStack_8cc8;
      }
      auVar8 = local_8da0;
      auVar68 = local_8dc0;
      alVar67 = local_8de0;
      auVar89 = ZEXT3264(auVar87);
      auVar84 = ZEXT1664(ZEXT416(uVar34));
      auVar85._2_2_ = sVar75;
      auVar85._0_2_ = sVar75;
      auVar85._4_2_ = sVar75;
      auVar85._6_2_ = sVar75;
      auVar85._8_2_ = sVar75;
      auVar85._10_2_ = sVar75;
      auVar85._12_2_ = sVar75;
      auVar85._14_2_ = sVar75;
      auVar85._16_2_ = sVar75;
      auVar85._18_2_ = sVar75;
      auVar85._20_2_ = sVar75;
      auVar85._22_2_ = sVar75;
      auVar85._24_2_ = sVar75;
      auVar85._26_2_ = sVar75;
      auVar85._28_2_ = sVar75;
      auVar85._30_2_ = sVar75;
      auVar86 = ZEXT3264(auVar85);
      auVar77 = ZEXT464(uVar58);
      auVar82._4_4_ = iVar59;
      auVar82._0_4_ = iVar59;
      auVar82._8_4_ = iVar59;
      auVar82._12_4_ = iVar59;
      auVar82._16_4_ = iVar59;
      auVar82._20_4_ = iVar59;
      auVar82._24_4_ = iVar59;
      auVar82._28_4_ = iVar59;
      auVar81._4_4_ = iVar52;
      auVar81._0_4_ = iVar52;
      auVar81._8_4_ = iVar52;
      auVar81._12_4_ = iVar52;
      auVar81._16_4_ = iVar52;
      auVar81._20_4_ = iVar52;
      auVar81._24_4_ = iVar52;
      auVar81._28_4_ = iVar52;
      auVar63 = ZEXT416(uVar54);
      uVar49 = (ulong)((uVar35 >> 1) - 1);
      lVar60 = (long)(int)(((uVar53 >> 1) - 1) * src_stride);
      lVar31 = -uVar49 - lVar60;
      alVar78[2] = _DAT_0046f0e0;
      alVar78[3] = _UNK_0046f0e8;
      alVar78[0] = _DAT_0046f0e0;
      alVar78[1] = _UNK_0046f0e8;
      auVar79._16_16_ = _DAT_0046ecc0;
      auVar79._0_16_ = _DAT_0046ecc0;
      auVar80._16_16_ = _DAT_0046ecd0;
      auVar80._0_16_ = _DAT_0046ecd0;
      local_8f00[1] = 0xe0d0d0c0c0b0b0a;
      local_8f00[0] = 0xa09090808070706;
      local_8f00[2] = 0xa09090808070706;
      local_8f00[3] = 0xe0d0d0c0c0b0b0a;
      uStack_8f78 = (undefined4)uStack_8cb8;
      uStack_8f74 = (undefined4)((ulong)uStack_8cb8 >> 0x20);
      uStack_8f70 = (undefined4)uStack_8cb0;
      uStack_8f6c = (undefined4)((ulong)uStack_8cb0 >> 0x20);
      uStack_8f68 = (undefined4)uStack_8ca8;
      uStack_8f64 = (undefined4)((ulong)uStack_8ca8 >> 0x20);
      lVar46 = (long)(int)(h + -3 + uVar53);
      palVar1 = (__m256i *)(lVar56 + -4);
      iVar52 = src_stride * 2;
      pauVar62 = (undefined1 (*) [16])(src + -(lVar60 + uVar49));
      lVar60 = lVar45 * 2;
      lVar61 = lVar42 * 2;
      auVar76 = ZEXT416(uVar58);
      filt = palVar1;
      iVar59 = w;
      local_8f60 = alVar78;
      local_8f40 = (__m256i)auVar79;
      local_8f20 = (__m256i)auVar80;
      for (lVar38 = 0; auVar83 = auVar77._0_16_, lVar38 < lVar56; lVar38 = lVar38 + 8) {
        auVar72 = auVar86._0_32_;
        if (uVar35 == 4) {
          iVar50 = 0;
          pauVar37 = (undefined1 (*) [32])local_8c60;
          pauVar43 = pauVar62;
          for (lVar48 = 0; lVar48 < lVar46; lVar48 = lVar48 + 2) {
            auVar69._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar43 + lVar45) + ZEXT116(1) * *pauVar43;
            auVar69._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar43 + lVar45);
            auVar80 = vpshufb_avx2(auVar69,(undefined1  [32])alVar78);
            auVar74 = vpshufb_avx2(auVar69,auVar79);
            auVar80 = vpmaddubsw_avx2(auVar80,auVar68);
            auVar74 = vpmaddubsw_avx2(auVar74,auVar8);
            auVar80 = vpaddw_avx2(auVar72,auVar80);
            auVar80 = vpaddw_avx2(auVar80,auVar74);
            auVar80 = vpsraw_avx2(auVar80,auVar83);
            *pauVar37 = auVar80;
            iVar50 = iVar50 + iVar52;
            pauVar37 = pauVar37 + 1;
            pauVar43 = (undefined1 (*) [16])(*pauVar43 + lVar60);
          }
          auVar3 = *(undefined1 (*) [16])(src + (long)iVar50 + lVar38 + lVar31);
          auVar71._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar3;
          auVar71._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
          auVar80 = vpshufb_avx2(auVar71,(undefined1  [32])alVar78);
          auVar79 = vpshufb_avx2(auVar71,auVar79);
          auVar80 = vpmaddubsw_avx2(auVar80,auVar68);
          auVar79 = vpmaddubsw_avx2(auVar79,auVar8);
LAB_003ae871:
          auVar80 = vpaddw_avx2(auVar72,auVar80);
          auVar79 = vpaddw_avx2(auVar80,auVar79);
        }
        else {
          if (uVar35 == 6) {
            iVar50 = 0;
            pauVar37 = (undefined1 (*) [32])local_8c60;
            pauVar43 = pauVar62;
            for (lVar48 = 0; lVar48 < lVar46; lVar48 = lVar48 + 2) {
              auVar70._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar43 + lVar45) + ZEXT116(1) * *pauVar43;
              auVar70._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar43 + lVar45);
              auVar74 = vpshufb_avx2(auVar70,(undefined1  [32])alVar78);
              auVar73 = vpshufb_avx2(auVar70,auVar79);
              auVar69 = vpshufb_avx2(auVar70,auVar80);
              auVar70 = vpmaddubsw_avx2(auVar74,(undefined1  [32])alVar67);
              auVar74 = vpmaddubsw_avx2(auVar73,auVar68);
              auVar73 = vpmaddubsw_avx2(auVar69,auVar8);
              auVar74 = vpaddw_avx2(auVar74,auVar73);
              auVar70 = vpaddw_avx2(auVar72,auVar70);
              auVar74 = vpaddw_avx2(auVar70,auVar74);
              auVar74 = vpsraw_avx2(auVar74,auVar83);
              *pauVar37 = auVar74;
              iVar50 = iVar50 + iVar52;
              pauVar37 = pauVar37 + 1;
              pauVar43 = (undefined1 (*) [16])(*pauVar43 + lVar60);
            }
            auVar3 = *(undefined1 (*) [16])(src + (long)iVar50 + lVar38 + lVar31);
            auVar73._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar3;
            auVar73._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
            auVar74 = vpshufb_avx2(auVar73,(undefined1  [32])alVar78);
            auVar79 = vpshufb_avx2(auVar73,auVar79);
            auVar70 = vpshufb_avx2(auVar73,auVar80);
            auVar80 = vpmaddubsw_avx2(auVar74,(undefined1  [32])alVar67);
            auVar79 = vpmaddubsw_avx2(auVar79,auVar68);
            auVar74 = vpmaddubsw_avx2(auVar70,auVar8);
            auVar79 = vpaddw_avx2(auVar79,auVar74);
            goto LAB_003ae871;
          }
          iVar50 = 0;
          pauVar37 = (undefined1 (*) [32])local_8c60;
          pauVar43 = pauVar62;
          w = iVar59;
          for (lVar48 = 0; lVar48 < lVar46; lVar48 = lVar48 + 2) {
            auVar72._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar43 + lVar45) + ZEXT116(1) * *pauVar43;
            auVar72._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar43 + lVar45);
            alVar9[0]._4_4_ = in_stack_ffffffffffff6dc4;
            alVar9[0]._0_4_ = in_stack_ffffffffffff6dc0;
            alVar9._8_12_ = in_stack_ffffffffffff6dc8;
            alVar9[2]._4_4_ = w;
            alVar9[3] = (longlong)dst;
            convolve_lowbd_x(&local_8de0,alVar9,&local_8f60,filt);
            auVar79 = vpaddw_avx2(auVar72,auVar85);
            auVar79 = vpsraw_avx2(auVar79,auVar76);
            *pauVar37 = auVar79;
            iVar50 = iVar50 + iVar52;
            pauVar37 = pauVar37 + 1;
            pauVar43 = (undefined1 (*) [16])(*pauVar43 + lVar60);
            filt = extraout_RDX;
          }
          auVar83 = *(undefined1 (*) [16])(src + (long)iVar50 + lVar38 + lVar31);
          auVar74._0_16_ = ZEXT116(0) * auVar83 + ZEXT116(1) * auVar83;
          auVar74._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar83;
          alVar10[0]._4_4_ = in_stack_ffffffffffff6dc4;
          alVar10[0]._0_4_ = in_stack_ffffffffffff6dc0;
          alVar10._8_12_ = in_stack_ffffffffffff6dc8;
          alVar10[2]._4_4_ = w;
          alVar10[3] = (longlong)dst;
          convolve_lowbd_x(&local_8de0,alVar10,&local_8f60,filt);
          auVar86 = ZEXT3264(auVar85);
          auVar79 = vpaddw_avx2(auVar85,auVar74);
          auVar84 = ZEXT1664(ZEXT416(uVar34));
          auVar89 = ZEXT3264(auVar87);
          auVar83 = auVar76;
          iVar59 = w;
        }
        auVar79 = vpsraw_avx2(auVar79,auVar83);
        *(undefined1 (*) [32])(local_8c60 + (ulong)(uint)((int)lVar48 << 3) * 2) = auVar79;
        auVar13._16_16_ = auStack_8c50;
        auVar13._0_16_ = local_8c60;
        auVar7._16_16_ = local_8c40;
        auVar7._0_16_ = auStack_8c50;
        auVar14._16_16_ = auStack_8c30;
        auVar14._0_16_ = local_8c40;
        auVar88._16_16_ = local_8c20;
        auVar88._0_16_ = auStack_8c30;
        auVar79 = auVar89._0_32_;
        auVar83 = auVar84._0_16_;
        if (uVar53 == 4) {
          auVar74 = vpunpcklwd_avx2(auVar13,auVar7);
          auVar70 = vpunpcklwd_avx2(auVar14,auVar88);
          auVar80 = vpunpckhwd_avx2(auVar13,auVar7);
          auVar72 = vpunpckhwd_avx2(auVar14,auVar88);
          pauVar37 = (undefined1 (*) [32])auStack_8c10;
          puVar44 = dst;
          for (filt = (__m256i *)0x0; auVar73 = auVar72, auVar69 = auVar70, (long)filt < lVar41;
              filt = (__m256i *)((long)*filt + 2)) {
            auVar72 = vpmaddwd_avx2(auVar79,auVar74);
            auVar74 = vpmaddwd_avx2(auVar90,auVar69);
            auVar70 = vpmaddwd_avx2(auVar79,auVar80);
            auVar71 = vpmaddwd_avx2(auVar90,auVar73);
            auVar80 = vpaddd_avx2(auVar82,auVar72);
            auVar80 = vpaddd_avx2(auVar80,auVar74);
            auVar72 = vpsrad_avx2(auVar80,auVar83);
            auVar80 = vpaddd_avx2(auVar82,auVar70);
            auVar80 = vpaddd_avx2(auVar80,auVar71);
            auVar74 = vpsrad_avx2(auVar80,auVar83);
            auVar80 = vpaddd_avx2(auVar81,auVar72);
            auVar72 = vpsrad_avx2(auVar80,auVar63);
            auVar80 = vpaddd_avx2(auVar81,auVar74);
            auVar80 = vpsrad_avx2(auVar80,auVar63);
            auVar80 = vpackssdw_avx2(auVar72,auVar80);
            auVar80 = vpackuswb_avx2(auVar80,auVar80);
            if (lVar38 < (long)palVar1) {
              *(long *)puVar44 = auVar80._0_8_;
              *(long *)(puVar44 + lVar42) = auVar80._16_8_;
            }
            else if (w == 4) {
              *(int *)puVar44 = auVar80._0_4_;
              *(int *)(puVar44 + lVar42) = auVar80._16_4_;
            }
            else {
              vpextrw_avx(auVar80._0_16_,0);
              vpextrw_avx(auVar80._16_16_,0);
            }
            auVar70 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar37[-1] + 0x10),*pauVar37);
            auVar72 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar37[-1] + 0x10),*pauVar37);
            puVar44 = puVar44 + lVar61;
            pauVar37 = pauVar37 + 1;
            auVar74 = auVar69;
            auVar80 = auVar73;
          }
        }
        else if (uVar53 == 6) {
          auVar74 = vpunpcklwd_avx2(auVar13,auVar7);
          auVar70 = vpunpcklwd_avx2(auVar14,auVar88);
          auVar80 = vpunpckhwd_avx2(auVar13,auVar7);
          auVar72 = vpunpckhwd_avx2(auVar14,auVar88);
          pauVar37 = (undefined1 (*) [32])auStack_8c10;
          puVar44 = dst;
          for (filt = (__m256i *)0x0; (long)filt < lVar41; filt = (__m256i *)((long)*filt + 2)) {
            auVar13 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar37[-1] + 0x10),*pauVar37);
            auVar71 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar37[-1] + 0x10),*pauVar37);
            auVar74 = vpmaddwd_avx2(local_9120,auVar74);
            auVar73 = vpmaddwd_avx2(auVar79,auVar70);
            auVar74 = vpaddd_avx2(auVar82,auVar74);
            auVar74 = vpaddd_avx2(auVar74,auVar73);
            auVar73 = vpmaddwd_avx2(auVar90,auVar13);
            auVar69 = vpmaddwd_avx2(local_9120,auVar80);
            auVar80 = vpaddd_avx2(auVar74,auVar73);
            auVar73 = vpmaddwd_avx2(auVar79,auVar72);
            auVar74 = vpaddd_avx2(auVar82,auVar69);
            auVar74 = vpaddd_avx2(auVar74,auVar73);
            auVar73 = vpmaddwd_avx2(auVar90,auVar71);
            auVar74 = vpaddd_avx2(auVar74,auVar73);
            auVar80 = vpsrad_avx2(auVar80,auVar83);
            auVar74 = vpsrad_avx2(auVar74,auVar83);
            auVar80 = vpaddd_avx2(auVar81,auVar80);
            auVar73 = vpsrad_avx2(auVar80,auVar63);
            auVar80 = vpaddd_avx2(auVar81,auVar74);
            auVar80 = vpsrad_avx2(auVar80,auVar63);
            auVar80 = vpackssdw_avx2(auVar73,auVar80);
            auVar80 = vpackuswb_avx2(auVar80,auVar80);
            if (lVar38 < (long)palVar1) {
              *(long *)puVar44 = auVar80._0_8_;
              *(long *)(puVar44 + lVar42) = auVar80._16_8_;
            }
            else if (w == 4) {
              *(int *)puVar44 = auVar80._0_4_;
              *(int *)(puVar44 + lVar42) = auVar80._16_4_;
            }
            else {
              vpextrw_avx(auVar80._0_16_,0);
              vpextrw_avx(auVar80._16_16_,0);
            }
            auVar86 = ZEXT3264(auVar86._0_32_);
            puVar44 = puVar44 + lVar61;
            pauVar37 = pauVar37 + 1;
            auVar80 = auVar72;
            auVar74 = auVar70;
            auVar70 = auVar13;
            auVar72 = auVar71;
          }
        }
        else {
          auVar74 = vpunpcklwd_avx2(auVar13,auVar7);
          auVar70 = vpunpcklwd_avx2(auVar14,auVar88);
          auVar79 = vpunpckhwd_avx2(auVar13,auVar7);
          auVar80 = vpunpckhwd_avx2(auVar14,auVar88);
          auVar24._16_16_ = auStack_8c10;
          auVar24._0_16_ = local_8c20;
          auVar26._16_16_ = local_8c00;
          auVar26._0_16_ = auStack_8c10;
          auVar73 = vpunpcklwd_avx2(auVar24,auVar26);
          auVar72 = vpunpckhwd_avx2(auVar24,auVar26);
          pauVar37 = (undefined1 (*) [32])auStack_8bf0;
          puVar44 = dst;
          for (filt = (__m256i *)0x0; (long)filt < lVar41; filt = (__m256i *)((long)*filt + 2)) {
            auVar14 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar37[-1] + 0x10),*pauVar37);
            auVar7 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar37[-1] + 0x10),*pauVar37);
            auVar88 = auVar89._0_32_;
            auVar69 = vpmaddwd_avx2(auVar88,auVar70);
            auVar71 = vpmaddwd_avx2(auVar90,auVar73);
            auVar69 = vpaddd_avx2(auVar69,auVar71);
            auVar71 = vpmaddwd_avx2(auVar88,auVar80);
            auVar13 = vpmaddwd_avx2(auVar90,auVar72);
            auVar71 = vpaddd_avx2(auVar71,auVar13);
            auVar74 = vpmaddwd_avx2(local_9120,auVar74);
            auVar74 = vpaddd_avx2(auVar82,auVar74);
            auVar74 = vpaddd_avx2(auVar69,auVar74);
            auVar19._8_4_ = uStack_8f78;
            auVar19._0_8_ = local_8cc0;
            auVar19._12_4_ = uStack_8f74;
            auVar19._16_4_ = uStack_8f70;
            auVar19._20_4_ = uStack_8f6c;
            auVar19._24_4_ = uStack_8f68;
            auVar19._28_4_ = uStack_8f64;
            auVar69 = vpmaddwd_avx2(auVar19,auVar14);
            auVar74 = vpaddd_avx2(auVar69,auVar74);
            auVar79 = vpmaddwd_avx2(local_9120,auVar79);
            auVar79 = vpaddd_avx2(auVar82,auVar79);
            auVar79 = vpaddd_avx2(auVar71,auVar79);
            auVar69 = vpmaddwd_avx2(auVar19,auVar7);
            auVar79 = vpaddd_avx2(auVar69,auVar79);
            auVar83 = auVar84._0_16_;
            auVar74 = vpsrad_avx2(auVar74,auVar83);
            auVar69 = vpsrad_avx2(auVar79,auVar83);
            auVar79 = vpaddd_avx2(auVar81,auVar74);
            auVar74 = vpsrad_avx2(auVar79,auVar63);
            auVar79 = vpaddd_avx2(auVar81,auVar69);
            auVar79 = vpsrad_avx2(auVar79,auVar63);
            auVar79 = vpackssdw_avx2(auVar74,auVar79);
            auVar79 = vpackuswb_avx2(auVar79,auVar79);
            if (lVar38 < (long)palVar1) {
              *(long *)puVar44 = auVar79._0_8_;
              *(long *)(puVar44 + lVar42) = auVar79._16_8_;
            }
            else if (w == 4) {
              *(int *)puVar44 = auVar79._0_4_;
              *(int *)(puVar44 + lVar42) = auVar79._16_4_;
            }
            else {
              vpextrw_avx(auVar79._0_16_,0);
              vpextrw_avx(auVar79._16_16_,0);
            }
            auVar89 = ZEXT3264(auVar88);
            puVar44 = puVar44 + lVar61;
            pauVar37 = pauVar37 + 1;
            auVar84 = ZEXT1664(auVar83);
            auVar79 = auVar80;
            auVar74 = auVar70;
            auVar70 = auVar73;
            auVar80 = auVar72;
            auVar72 = auVar7;
            auVar73 = auVar14;
          }
        }
        pauVar62 = (undefined1 (*) [16])(*pauVar62 + 8);
        dst = dst + 8;
        auVar77 = ZEXT1664(auVar76);
        alVar78[2] = _DAT_0046f0e0;
        alVar78[3] = _UNK_0046f0e8;
        alVar78[0] = _DAT_0046f0e0;
        alVar78[1] = _UNK_0046f0e8;
        auVar79._16_16_ = _DAT_0046ecc0;
        auVar79._0_16_ = _DAT_0046ecc0;
        auVar80._16_16_ = _DAT_0046ecd0;
        auVar80._0_16_ = _DAT_0046ecd0;
      }
    }
    else {
      uVar53 = (0xe - conv_params->round_0) - conv_params->round_1;
      bVar40 = (byte)conv_params->round_0;
      bVar39 = 0x16 - bVar40;
      local_9060._4_4_ = ((1 << (bVar40 & 0x1f)) >> 1) + 0x4000;
      bVar40 = (byte)conv_params->round_1;
      local_9060._0_4_ = local_9060._4_4_;
      local_9060._8_4_ = local_9060._4_4_;
      local_9060._12_4_ = local_9060._4_4_;
      local_9060._16_4_ = local_9060._4_4_;
      local_9060._20_4_ = local_9060._4_4_;
      local_9060._24_4_ = local_9060._4_4_;
      local_9060._28_4_ = local_9060._4_4_;
      uVar34 = conv_params->round_0;
      iVar51 = ((1 << (bVar40 & 0x1f)) >> 1) + (1 << (bVar39 & 0x1f));
      iVar52 = 1 << (bVar39 - bVar40 & 0x1f);
      uVar35 = conv_params->round_1;
      iVar50 = ((1 << ((byte)uVar53 & 0x1f)) >> 1) - ((iVar52 >> 1) + iVar52);
      local_8d40 = 0;
      uStack_8d38 = 0;
      uStack_8d30 = 0;
      uStack_8d28 = 0;
      local_8d60 = 0;
      uStack_8d58 = 0;
      uStack_8d50 = 0;
      uStack_8d48 = 0;
      local_8d80 = 0;
      uStack_8d78 = 0;
      uStack_8d70 = 0;
      uStack_8d68 = 0;
      local_8da0 = ZEXT1632(ZEXT816(0));
      local_8dc0 = ZEXT1632(ZEXT816(0));
      local_8de0 = (__m256i)ZEXT1632(ZEXT816(0));
      local_8c80 = 0;
      uStack_8c78 = 0;
      uStack_8c70 = 0;
      uStack_8c68 = 0;
      local_8ca0 = 0;
      uStack_8c98 = 0;
      uStack_8c90 = 0;
      uStack_8c88 = 0;
      local_8cc0 = 0;
      uStack_8cb8 = 0;
      uStack_8cb0 = 0;
      uStack_8ca8 = 0;
      local_8ce0 = 0;
      uStack_8cd8 = 0;
      uStack_8cd0 = 0;
      uStack_8cc8 = 0;
      local_8d00 = 0;
      uStack_8cf8 = 0;
      uStack_8cf0 = 0;
      uStack_8ce8 = 0;
      local_8d20 = 0;
      lStack_8d18 = 0;
      lStack_8d10 = 0;
      lStack_8d08 = 0;
      iVar59 = w;
      prepare_coeffs_12taps(filter_params_x,subpel_x_qn,&local_8de0);
      prepare_coeffs_12taps(filter_params_y,subpel_y_qn,(__m256i *)&local_8d20);
      uVar58 = h + 0xb;
      iVar52 = src_stride * 5;
      lVar60 = 0;
      uVar49 = 0;
      if (0 < (int)uVar58) {
        uVar49 = (ulong)uVar58;
      }
      pauVar43 = (undefined1 (*) [16])(src + ~(long)iVar52);
      iVar36 = src_stride * 2;
      pauVar62 = (undefined1 (*) [16])(src + (-5 - (long)iVar52));
      for (; lVar60 < lVar56; lVar60 = lVar60 + 8) {
        if (w < 5) {
          puVar57 = (undefined8 *)local_8c60;
          pauVar47 = pauVar62;
          iVar55 = src_stride;
          for (lVar61 = 0; w = iVar59, lVar61 < (int)uVar58; lVar61 = lVar61 + 2) {
            auVar63 = *(undefined1 (*) [16])
                       (*(undefined1 (*) [16])(src + (-5 - (long)iVar52)) + iVar55);
            auVar64._0_16_ = ZEXT116(0) * auVar63 + ZEXT116(1) * *pauVar47;
            auVar64._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar63;
            auVar8 = vpunpcklbw_avx2(auVar64,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar90 = vpunpckhbw_avx2(auVar64,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar68 = vpshufd_avx2(auVar8,0xe6);
            auVar87 = vpshuflw_avx2(auVar68,0x50);
            auVar87 = vpshufhw_avx2(auVar87,0xfa);
            auVar8 = vpunpcklwd_avx2(auVar8,auVar8);
            local_8f60 = (__m256i)vpalignr_avx2(auVar68,auVar8,2);
            local_8f40 = (__m256i)vpalignr_avx2(auVar87,auVar8,10);
            auVar8 = vpunpcklwd_avx2(auVar90,auVar90);
            local_8f20 = (__m256i)vpalignr_avx2(auVar90,auVar87,2);
            local_8f00 = (__m256i)vpalignr_avx2(auVar8,auVar87,10);
            auVar68 = vpshufd_avx2(auVar90,0xe6);
            auVar87 = vpshuflw_avx2(auVar68,0x50);
            auVar87 = vpshufd_avx2(auVar87,0xf4);
            local_8ee0 = (__m256i)vpalignr_avx2(auVar68,auVar8,2);
            auVar68 = vpalignr_avx2(auVar87,auVar8,10);
            local_8ec0 = (__m256i)auVar68;
            convolve_12taps(&local_8f60,&local_8de0);
            auVar68 = vpaddd_avx2(auVar68,local_9060);
            auVar68 = vpsrad_avx2(auVar68,ZEXT416(uVar34));
            auVar68 = vpackssdw_avx2(auVar68,auVar68);
            if (iVar59 < 3) {
              *(short *)puVar57 = auVar68._0_2_;
              *(short *)((long)puVar57 + 2) = auVar68._2_2_;
              *(short *)(puVar57 + 2) = auVar68._16_2_;
              *(short *)((long)puVar57 + 0x12) = auVar68._18_2_;
            }
            else {
              *puVar57 = auVar68._0_8_;
              puVar57[2] = auVar68._16_8_;
            }
            puVar57 = puVar57 + 4;
            iVar55 = iVar55 + iVar36;
            pauVar47 = (undefined1 (*) [16])(*pauVar47 + lVar45 * 2);
          }
        }
        else {
          pauVar47 = pauVar43;
          for (lVar61 = 0; w = iVar59, uVar49 << 4 != lVar61; lVar61 = lVar61 + 0x10) {
            auVar65._0_16_ =
                 ZEXT116(0) * *pauVar47 + ZEXT116(1) * *(undefined1 (*) [16])(pauVar47[-1] + 0xc);
            auVar65._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *pauVar47
            ;
            auVar8 = vpunpcklbw_avx2(auVar65,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar90 = vpunpckhbw_avx2(auVar65,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar68 = vpshufd_avx2(auVar8,0xe6);
            auVar87 = vpshuflw_avx2(auVar68,0x50);
            auVar87 = vpshufhw_avx2(auVar87,0xfa);
            auVar8 = vpunpcklwd_avx2(auVar8,auVar8);
            local_8f60 = (__m256i)vpalignr_avx2(auVar68,auVar8,2);
            local_8f40 = (__m256i)vpalignr_avx2(auVar87,auVar8,10);
            auVar8 = vpunpcklwd_avx2(auVar90,auVar90);
            local_8f20 = (__m256i)vpalignr_avx2(auVar90,auVar87,2);
            local_8f00 = (__m256i)vpalignr_avx2(auVar8,auVar87,10);
            auVar68 = vpshufd_avx2(auVar90,0xe6);
            auVar87 = vpshuflw_avx2(auVar68,0x50);
            auVar87 = vpshufd_avx2(auVar87,0xf4);
            local_8ee0 = (__m256i)vpalignr_avx2(auVar68,auVar8,2);
            auVar68 = vpalignr_avx2(auVar87,auVar8,10);
            local_8ec0 = (__m256i)auVar68;
            convolve_12taps(&local_8f60,&local_8de0);
            auVar68 = vpaddd_avx2(auVar68,local_9060);
            auVar68 = vpsrad_avx2(auVar68,ZEXT416(uVar34));
            auVar63 = vpackssdw_avx(auVar68._0_16_,auVar68._16_16_);
            *(undefined1 (*) [16])(local_8c60 + lVar61) = auVar63;
            pauVar47 = (undefined1 (*) [16])(*pauVar47 + lVar45);
          }
        }
        auVar8._16_16_ = auStack_8c50;
        auVar8._0_16_ = local_8c60;
        auVar20._16_16_ = local_8c40;
        auVar20._0_16_ = auStack_8c50;
        auVar21._16_16_ = auStack_8c30;
        auVar21._0_16_ = local_8c40;
        auVar22._16_16_ = local_8c20;
        auVar22._0_16_ = auStack_8c30;
        auVar23._16_16_ = auStack_8c10;
        auVar23._0_16_ = local_8c20;
        auVar25._16_16_ = local_8c00;
        auVar25._0_16_ = auStack_8c10;
        auVar27._16_16_ = auStack_8bf0;
        auVar27._0_16_ = local_8c00;
        auVar28._16_16_ = local_8be0;
        auVar28._0_16_ = auStack_8bf0;
        auVar29._16_16_ = auStack_8bd0;
        auVar29._0_16_ = local_8be0;
        auVar30._16_16_ = local_8bc0;
        auVar30._0_16_ = auStack_8bd0;
        local_8f60 = (__m256i)vpunpcklwd_avx2(auVar8,auVar20);
        local_8f40 = (__m256i)vpunpcklwd_avx2(auVar21,auVar22);
        alVar9 = (__m256i)vpunpcklwd_avx2(auVar23,auVar25);
        alVar10 = (__m256i)vpunpcklwd_avx2(auVar27,auVar28);
        alVar11 = (__m256i)vpunpcklwd_avx2(auVar29,auVar30);
        local_8ea0 = (__m256i)vpunpckhwd_avx2(auVar8,auVar20);
        local_8e80 = (__m256i)vpunpckhwd_avx2(auVar21,auVar22);
        alVar67 = (__m256i)vpunpckhwd_avx2(auVar23,auVar25);
        alVar78 = (__m256i)vpunpckhwd_avx2(auVar27,auVar28);
        local_8e20 = (__m256i)vpunpckhwd_avx2(auVar29,auVar30);
        pauVar37 = (undefined1 (*) [32])auStack_8bb0;
        puVar44 = dst;
        for (lVar61 = 0; alVar16 = alVar9, alVar15 = alVar67, alVar9 = local_8e20,
            alVar33 = local_8e80, alVar32 = local_8f40, local_8e60 = alVar15, local_8e40 = alVar78,
            lVar61 < lVar41; lVar61 = lVar61 + 2) {
          alVar12 = (__m256i)vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar37[-1] + 0x10),*pauVar37);
          alVar6 = (__m256i)vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar37[-1] + 0x10),*pauVar37);
          alVar66 = alVar6;
          local_8f20 = alVar16;
          local_8f00 = alVar10;
          local_8ee0 = alVar11;
          local_8ec0 = alVar12;
          local_8e00 = alVar6;
          convolve_12taps(&local_8f60,(__m256i *)&local_8d20);
          alVar67 = alVar66;
          convolve_12taps(&local_8ea0,(__m256i *)&local_8d20);
          auVar18._4_4_ = iVar51;
          auVar18._0_4_ = iVar51;
          auVar18._8_4_ = iVar51;
          auVar18._12_4_ = iVar51;
          auVar18._16_4_ = iVar51;
          auVar18._20_4_ = iVar51;
          auVar18._24_4_ = iVar51;
          auVar18._28_4_ = iVar51;
          auVar68 = vpaddd_avx2(auVar18,(undefined1  [32])alVar66);
          auVar87 = vpsrad_avx2(auVar68,ZEXT416(uVar35));
          auVar68 = vpaddd_avx2(auVar18,(undefined1  [32])alVar67);
          auVar90 = vpsrad_avx2(auVar68,ZEXT416(uVar35));
          auVar17._4_4_ = iVar50;
          auVar17._0_4_ = iVar50;
          auVar17._8_4_ = iVar50;
          auVar17._12_4_ = iVar50;
          auVar17._16_4_ = iVar50;
          auVar17._20_4_ = iVar50;
          auVar17._24_4_ = iVar50;
          auVar17._28_4_ = iVar50;
          auVar68 = vpaddd_avx2(auVar87,auVar17);
          auVar87 = vpsrad_avx2(auVar68,ZEXT416(uVar53));
          auVar68 = vpaddd_avx2(auVar90,auVar17);
          auVar68 = vpsrad_avx2(auVar68,ZEXT416(uVar53));
          auVar68 = vpackssdw_avx2(auVar87,auVar68);
          auVar68 = vpackuswb_avx2(auVar68,auVar68);
          if (lVar60 < lVar56 + -4) {
            *(long *)dst = auVar68._0_8_;
            *(long *)(dst + lVar42) = auVar68._16_8_;
          }
          else if (w == 4) {
            *(int *)dst = auVar68._0_4_;
            *(int *)(dst + lVar42) = auVar68._16_4_;
          }
          else {
            vpextrw_avx(auVar68._0_16_,0);
            vpextrw_avx(auVar68._16_16_,0);
          }
          dst = dst + lVar42 * 2;
          pauVar37 = pauVar37 + 1;
          alVar67 = alVar78;
          alVar78 = alVar9;
          alVar9 = alVar10;
          alVar10 = alVar11;
          alVar11 = alVar12;
          local_8f60 = alVar32;
          local_8f40 = alVar16;
          local_8ea0 = alVar33;
          local_8e80 = alVar15;
          local_8e20 = alVar6;
        }
        pauVar43 = (undefined1 (*) [16])(*pauVar43 + 8);
        src_stride = src_stride + 8;
        pauVar62 = (undefined1 (*) [16])(*pauVar62 + 8);
        dst = puVar44 + 8;
        iVar59 = w;
      }
    }
  }
  else {
    (**(code **)(av1_convolve_2d_sr_specialized_avx2_convolve_2d_sr_hor_tap_func_table +
                (ulong)uVar34 * 8))
              ((long)src - (long)(int)(((uVar35 >> 1) - 1) * src_stride),src_stride,w,uVar35 + h,
               filter_params_x,subpel_x_qn,(int)local_8c60);
    (**(code **)(av1_convolve_2d_sr_specialized_avx2_convolve_2d_sr_ver_tap_func_table +
                (ulong)(uVar35 - (subpel_y_qn == 8)) * 8))
              (local_8c60,w,h,filter_params_y,subpel_y_qn,dst,dst_stride);
  }
  return;
}

Assistant:

void av1_convolve_2d_sr_avx2(
    const uint8_t *src, int32_t src_stride, uint8_t *dst, int32_t dst_stride,
    int32_t w, int32_t h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int32_t subpel_x_qn,
    const int32_t subpel_y_qn, ConvolveParams *conv_params) {
#if CONFIG_SVT_AV1
  const int32_t tap_x = get_filter_tap(filter_params_x, subpel_x_qn);
  const int32_t tap_y = get_filter_tap(filter_params_y, subpel_y_qn);

  const bool use_general = (tap_x == 12 || tap_y == 12);
  if (use_general) {
    convolve_2d_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                filter_params_x, filter_params_y, subpel_x_qn,
                                subpel_y_qn, conv_params);
  } else {
    av1_convolve_2d_sr_specialized_avx2(src, src_stride, dst, dst_stride, w, h,
                                        filter_params_x, filter_params_y,
                                        subpel_x_qn, subpel_y_qn, conv_params);
  }
#else
  convolve_2d_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                              filter_params_x, filter_params_y, subpel_x_qn,
                              subpel_y_qn, conv_params);
#endif
}